

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name)

{
  bool bVar1;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [39];
  allocator local_49;
  string local_48 [48];
  string *local_18;
  string *name_local;
  NamePattern *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  Pattern::Pattern(&this->super_Pattern);
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_001ea298;
  toLower((Catch *)&this->m_name,local_18);
  this->m_wildcard = NoWildcard;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"*",&local_49);
  bVar1 = startsWith(&this->m_name,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&this->m_name);
    std::__cxx11::string::operator=((string *)&this->m_name,local_70);
    std::__cxx11::string::~string(local_70);
    this->m_wildcard = WildcardAtStart;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"*",&local_91);
  bVar1 = endsWith(&this->m_name,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b8,(ulong)&this->m_name);
    std::__cxx11::string::operator=((string *)&this->m_name,local_b8);
    std::__cxx11::string::~string(local_b8);
    this->m_wildcard = this->m_wildcard | WildcardAtEnd;
  }
  return;
}

Assistant:

NamePattern( std::string const& name ) : m_name( toLower( name ) ), m_wildcard( NoWildcard ) {
                if( startsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 1 );
                    m_wildcard = WildcardAtStart;
                }
                if( endsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 0, m_name.size()-1 );
                    m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
                }
            }